

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

mat44 * nifti_mat44_inverse(mat44 R)

{
  undefined1 auVar1 [16];
  mat44 *in_RDI;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  double local_b8;
  double dStack_90;
  
  dVar6 = (double)in_stack_00000008;
  dVar17 = (double)in_stack_0000000c;
  dVar5 = (double)in_stack_00000010;
  dVar3 = (double)in_stack_0000001c;
  dVar4 = (double)in_stack_00000028;
  dVar13 = (double)in_stack_00000018;
  dVar14 = (double)in_stack_0000002c;
  dVar15 = (double)in_stack_00000030;
  dVar16 = (double)in_stack_00000020;
  dVar7 = dVar13 * dVar17;
  dVar8 = dVar3 * dVar4;
  dVar11 = dVar4 * dVar17;
  auVar1._8_4_ = SUB84(dVar16,0);
  auVar1._0_8_ = dVar16;
  auVar1._12_4_ = (int)((ulong)dVar16 >> 0x20);
  local_b8 = (dVar11 * dVar16 +
             dVar14 * dVar13 * dVar5 +
             ((dVar3 * dVar6 * dVar15 - dVar16 * dVar14 * dVar6) - dVar7 * dVar15)) - dVar8 * dVar5;
  if ((local_b8 != 0.0) || (NAN(local_b8))) {
    local_b8 = 1.0 / local_b8;
  }
  dVar9 = (double)in_stack_00000034;
  dVar12 = (double)in_stack_00000024;
  dStack_90 = auVar1._8_8_;
  dVar10 = (double)in_stack_00000014;
  in_RDI->m[0][0] = (float)((dVar15 * dVar3 + -dVar14 * dVar16) * local_b8);
  in_RDI->m[0][1] = (float)((-dVar17 * dVar15 + dVar5 * dVar14) * local_b8);
  in_RDI->m[0][2] = (float)((dVar17 * dVar16 + -(dVar3 * dVar5)) * local_b8);
  in_RDI->m[0][3] =
       (float)((dVar14 * dVar10 * dStack_90 +
               (((dVar3 * dVar5 * dVar9 + (dVar17 * dVar12 * dVar15 - dVar16 * dVar17 * dVar9)) -
                dVar3 * dVar10 * dVar15) - dVar5 * dVar14 * dVar12)) * local_b8);
  in_RDI->m[1][0] = (float)((-dVar13 * dVar15 + dVar16 * dVar4) * local_b8);
  in_RDI->m[1][1] = (float)((dVar6 * dVar15 + -(dVar4 * dVar5)) * local_b8);
  in_RDI->m[1][2] = (float)((-dVar6 * dVar16 + dVar5 * dVar13) * local_b8);
  in_RDI->m[1][3] =
       (float)((-dVar4 * dVar10 * dStack_90 +
               dVar4 * dVar5 * dVar12 +
               dVar13 * dVar10 * dVar15 +
               ((dVar16 * dVar6 * dVar9 - dVar6 * dVar12 * dVar15) - dVar5 * dVar13 * dVar9)) *
              local_b8);
  in_RDI->m[2][0] = (float)((dVar14 * dVar13 + -dVar8) * local_b8);
  in_RDI->m[2][1] = (float)((-dVar6 * dVar14 + dVar11) * local_b8);
  in_RDI->m[2][2] = (float)((-dVar7 + dVar3 * dVar6) * local_b8);
  in_RDI->m[2][3] =
       (float)(((((dVar7 * dVar9 + (dVar14 * dVar6 * dVar12 - dVar3 * dVar6 * dVar9)) -
                 dVar14 * dVar13 * dVar10) - dVar12 * dVar11) + dVar10 * dVar8) * local_b8);
  in_RDI->m[3][2] = 0.0;
  *(float *)((long)(in_RDI->m + 3) + 0) = 0.0;
  *(float *)((long)(in_RDI->m + 3) + 4) = 0.0;
  fVar2 = 1.0;
  if ((local_b8 == 0.0) && (!NAN(local_b8))) {
    fVar2 = 0.0;
  }
  in_RDI->m[3][3] = fVar2;
  return in_RDI;
}

Assistant:

mat44 nifti_mat44_inverse( mat44 R )
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33,v1,v2,v3 , deti ;
   mat44 Q ;
                                                       /*  INPUT MATRIX IS:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 v1 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 v2 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 v3 ] */
   v1  = R.m[0][3]; v2  = R.m[1][3]; v3  = R.m[2][3];  /* [  0   0   0   1 ] */

   deti = r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;

   if( deti != 0.0l ) deti = 1.0l / deti ;

   Q.m[0][0] = (float)( deti*( r22*r33-r32*r23) ) ;
   Q.m[0][1] = (float)( deti*(-r12*r33+r32*r13) ) ;
   Q.m[0][2] = (float)( deti*( r12*r23-r22*r13) ) ;
   Q.m[0][3] = (float)( deti*(-r12*r23*v3+r12*v2*r33+r22*r13*v3
                     -r22*v1*r33-r32*r13*v2+r32*v1*r23) ) ;

   Q.m[1][0] = (float)( deti*(-r21*r33+r31*r23) ) ;
   Q.m[1][1] = (float)( deti*( r11*r33-r31*r13) ) ;
   Q.m[1][2] = (float)( deti*(-r11*r23+r21*r13) ) ;
   Q.m[1][3] = (float)( deti*( r11*r23*v3-r11*v2*r33-r21*r13*v3
                     +r21*v1*r33+r31*r13*v2-r31*v1*r23) ) ;

   Q.m[2][0] = (float)( deti*( r21*r32-r31*r22) ) ;
   Q.m[2][1] = (float)( deti*(-r11*r32+r31*r12) ) ;
   Q.m[2][2] = (float)( deti*( r11*r22-r21*r12) ) ;
   Q.m[2][3] = (float)( deti*(-r11*r22*v3+r11*r32*v2+r21*r12*v3
                     -r21*r32*v1-r31*r12*v2+r31*r22*v1) ) ;

   Q.m[3][0] = Q.m[3][1] = Q.m[3][2] = 0.0l ;
   Q.m[3][3] = (deti == 0.0l) ? 0.0l : 1.0l ; /* failure flag if deti == 0 */

   return Q ;
}